

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O1

string * __thiscall Kernel::Clause::toString_abi_cxx11_(string *__return_storage_ptr__,Clause *this)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  SplitSet *pSVar4;
  bool bVar5;
  string *psVar6;
  uint uVar7;
  long *plVar8;
  Entry *pEVar9;
  undefined8 *puVar10;
  ulong uVar11;
  ulong *puVar12;
  ulong *puVar13;
  Int *pIVar14;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint i;
  uint i_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  uint i_01;
  int extraout_EDX_06;
  int extraout_EDX_07;
  int extraout_EDX_08;
  int extraout_EDX_09;
  uint i_02;
  int extraout_EDX_10;
  int extraout_EDX_11;
  int extraout_EDX_12;
  int extraout_EDX_13;
  int extraout_EDX_14;
  int extraout_EDX_15;
  int extraout_EDX_16;
  int extraout_EDX_17;
  int extraout_EDX_18;
  int extraout_EDX_19;
  int extraout_EDX_20;
  int extraout_EDX_21;
  uint i_03;
  int extraout_EDX_22;
  int extraout_EDX_23;
  int extraout_EDX_24;
  int extraout_EDX_25;
  int extraout_EDX_26;
  int extraout_EDX_27;
  uint i_04;
  int extraout_EDX_28;
  int extraout_EDX_29;
  int extraout_EDX_30;
  int extraout_EDX_31;
  int extraout_EDX_32;
  int extraout_EDX_33;
  int extraout_EDX_34;
  VirtualIterator<unsigned_int> *it;
  SplitSet *splits;
  int iVar15;
  uint uVar16;
  uint *puVar17;
  uint *puVar18;
  undefined8 uVar19;
  Int *this_00;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> varSortMap;
  Stack<unsigned_int> vars;
  string quantifier;
  undefined1 local_148 [16];
  int iStack_138;
  int iStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 local_124;
  undefined1 local_120 [32];
  string local_100;
  string *local_e0;
  string local_d8;
  uint local_b4;
  long *local_b0 [2];
  long local_a0 [2];
  string local_90;
  Stack<unsigned_int> local_70;
  string local_50;
  
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"");
  uVar16 = extraout_EDX;
  local_e0 = __return_storage_ptr__;
  if ((::Lib::env->_proofExtra).super_OptionValue<Shell::Options::ProofExtra>.actualValue != OFF) {
    local_148._0_4_ = 1;
    local_148._4_4_ = 0;
    local_148._8_4_ = 0;
    local_148._12_4_ = 0;
    iStack_138 = 0;
    iStack_134 = 0;
    uStack_130 = 0;
    uStack_12c = 0;
    uStack_128 = 0;
    local_124 = 0;
    SortHelper::collectVariableSorts
              (&this->super_Unit,
               (DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)
               local_148);
    local_70._capacity = (size_t)::operator_new(0x28);
    *(undefined4 *)(local_70._capacity + 8) = 0;
    *(undefined ***)local_70._capacity = &PTR__IteratorCore_00b66fa0;
    *(long *)(local_70._capacity + 0x10) = CONCAT44(uStack_12c,uStack_130);
    *(long *)(local_70._capacity + 0x18) = CONCAT44(local_124,uStack_128);
    *(undefined4 *)(local_70._capacity + 0x20) = local_148._0_4_;
    *(undefined4 *)(local_70._capacity + 8) = 1;
    ::Lib::Stack<unsigned_int>::fromIterator<Lib::VirtualIterator<unsigned_int>>
              ((Stack<unsigned_int> *)local_120,&local_70,it);
    if ((long *)local_70._capacity != (long *)0x0) {
      plVar8 = (long *)(local_70._capacity + 8);
      *(int *)plVar8 = (int)*plVar8 + -1;
      if ((int)*plVar8 == 0) {
        (**(code **)(*(long *)local_70._capacity + 8))();
      }
    }
    local_70._stack = (uint *)this;
    ::Lib::Stack<unsigned_int>::sort<std::less<unsigned_int>>((Stack<unsigned_int> *)local_120);
    iVar15 = (int)((ulong)(local_120._16_8_ - local_120._8_8_) >> 2);
    if (iVar15 != 0) {
      std::__cxx11::string::append((char *)local_b0);
      local_70._cursor = (uint *)local_120._16_8_;
      if (local_120._8_8_ != local_120._16_8_) {
        paVar3 = &local_d8.field_2;
        puVar18 = (uint *)local_120._8_8_;
        do {
          iVar15 = iVar15 + -1;
          uVar16 = *puVar18;
          local_70._end = (uint *)(ulong)(uVar16 * 4 + 1);
          TermList::toString_abi_cxx11_(&local_50,(TermList *)&local_70._end,false);
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
          puVar12 = (ulong *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar12) {
            local_d8.field_2._M_allocated_capacity = *puVar12;
            local_d8.field_2._8_8_ = plVar8[3];
            local_d8._M_dataplus._M_p = (pointer)paVar3;
          }
          else {
            local_d8.field_2._M_allocated_capacity = *puVar12;
            local_d8._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_d8._M_string_length = plVar8[1];
          *plVar8 = (long)puVar12;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          local_b4 = uVar16;
          pEVar9 = ::Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>
                   ::findEntry((DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>
                                *)local_148,&local_b4);
          TermList::toString_abi_cxx11_(&local_90,&pEVar9->_val,false);
          uVar19 = (uint *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != paVar3) {
            uVar19 = local_d8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar19 < (uint *)(local_90._M_string_length + local_d8._M_string_length)) {
            uVar19 = (uint *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              uVar19 = local_90.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar19 < (uint *)(local_90._M_string_length + local_d8._M_string_length))
            goto LAB_0052904e;
            puVar10 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_90,0,(char *)0x0,(ulong)local_d8._M_dataplus._M_p);
          }
          else {
LAB_0052904e:
            puVar10 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_d8,(ulong)local_90._M_dataplus._M_p);
          }
          puVar12 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar12) {
            local_100.field_2._M_allocated_capacity = *puVar12;
            local_100.field_2._8_8_ = puVar10[3];
            local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
          }
          else {
            local_100.field_2._M_allocated_capacity = *puVar12;
            local_100._M_dataplus._M_p = (pointer)*puVar10;
          }
          local_100._M_string_length = puVar10[1];
          *puVar10 = puVar12;
          puVar10[1] = 0;
          *(undefined1 *)puVar12 = 0;
          std::__cxx11::string::_M_append((char *)local_b0,(ulong)local_100._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            ::operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1
                             );
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            ::operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != paVar3) {
            ::operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            ::operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if (iVar15 != 0) {
            std::__cxx11::string::append((char *)local_b0);
          }
          puVar18 = puVar18 + 1;
        } while (puVar18 != local_70._cursor);
      }
      std::__cxx11::string::append((char *)local_b0);
      __return_storage_ptr__ = local_e0;
    }
    this = (Clause *)local_70._stack;
    if ((uint *)local_120._8_8_ != (uint *)0x0) {
      uVar11 = local_120._0_8_ * 4 + 0xfU & 0xfffffffffffffff0;
      if (uVar11 == 0) {
        *(undefined8 *)local_120._8_8_ = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_120._8_8_;
      }
      else if (uVar11 < 0x11) {
        *(undefined8 *)local_120._8_8_ = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_120._8_8_;
      }
      else if (uVar11 < 0x19) {
        *(undefined8 *)local_120._8_8_ = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_120._8_8_;
      }
      else if (uVar11 < 0x21) {
        *(undefined8 *)local_120._8_8_ = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_120._8_8_;
      }
      else if (uVar11 < 0x31) {
        *(undefined8 *)local_120._8_8_ = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_120._8_8_;
      }
      else if (uVar11 < 0x41) {
        *(undefined8 *)local_120._8_8_ = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_120._8_8_;
      }
      else {
        ::operator_delete((void *)local_120._8_8_,0x10);
      }
    }
    ::Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
              ((DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)
               local_148);
    uVar16 = extraout_EDX_00;
  }
  ::Lib::Int::toString_abi_cxx11_(&local_100,(Int *)(ulong)(this->super_Unit)._number,uVar16);
  puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
  puVar12 = (ulong *)(local_120 + 0x10);
  puVar13 = puVar10 + 2;
  if ((ulong *)*puVar10 == puVar13) {
    local_120._16_8_ = *puVar13;
    local_120._24_8_ = puVar10[3];
    local_120._0_8_ = puVar12;
  }
  else {
    local_120._16_8_ = *puVar13;
    local_120._0_8_ = (ulong *)*puVar10;
  }
  local_120._8_8_ = puVar10[1];
  *puVar10 = puVar13;
  puVar10[1] = 0;
  *(undefined1 *)(puVar10 + 2) = 0;
  puVar10 = (undefined8 *)std::__cxx11::string::_M_append(local_120,(ulong)local_b0[0]);
  pIVar14 = (Int *)(puVar10 + 2);
  if ((Int *)*puVar10 == pIVar14) {
    iStack_138 = (int)*(undefined8 *)pIVar14;
    iStack_134 = (int)((ulong)*(undefined8 *)pIVar14 >> 0x20);
    uStack_130 = (undefined4)puVar10[3];
    uStack_12c = (undefined4)((ulong)puVar10[3] >> 0x20);
    local_148._0_8_ = (Int *)&iStack_138;
  }
  else {
    iStack_138 = (int)*(undefined8 *)pIVar14;
    iStack_134 = (int)((ulong)*(undefined8 *)pIVar14 >> 0x20);
    local_148._0_8_ = (Int *)*puVar10;
  }
  local_148._8_4_ = (undefined4)puVar10[1];
  local_148._12_4_ = (undefined4)((ulong)puVar10[1] >> 0x20);
  *puVar10 = pIVar14;
  puVar10[1] = 0;
  *(undefined1 *)(puVar10 + 2) = 0;
  literalsOnlyToString_abi_cxx11_(&local_d8,this);
  puVar18 = (uint *)(local_d8._M_string_length + CONCAT44(local_148._12_4_,local_148._8_4_));
  puVar17 = (uint *)0xf;
  if ((Int *)local_148._0_8_ != (Int *)&iStack_138) {
    puVar17 = (uint *)CONCAT44(iStack_134,iStack_138);
  }
  if (puVar17 < puVar18) {
    uVar19 = (uint *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      uVar19 = local_d8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar19 < puVar18) goto LAB_0052937f;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,local_148._0_8_);
  }
  else {
LAB_0052937f:
    puVar10 = (undefined8 *)
              std::__cxx11::string::_M_append(local_148,(ulong)local_d8._M_dataplus._M_p);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar10 + 2;
  if ((size_type *)*puVar10 == psVar1) {
    uVar19 = puVar10[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar19;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar10;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar10[1];
  *puVar10 = psVar1;
  puVar10[1] = 0;
  *(undefined1 *)psVar1 = 0;
  paVar3 = &local_d8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar3) {
    ::operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((Int *)local_148._0_8_ != (Int *)&iStack_138) {
    ::operator_delete((void *)local_148._0_8_,CONCAT44(iStack_134,iStack_138) + 1);
  }
  if ((ulong *)local_120._0_8_ != puVar12) {
    ::operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
  }
  paVar2 = &local_100.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != paVar2) {
    ::operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  pSVar4 = (this->super_Unit)._inference._splits;
  if ((pSVar4 != (SplitSet *)0x0) && (pSVar4->_size != 0)) {
    local_100._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100," <- (","");
    Saturation::Splitter::splitsToString_abi_cxx11_
              (&local_d8,(Splitter *)(this->super_Unit)._inference._splits,splits);
    uVar19 = (uint *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar2) {
      uVar19 = local_100.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar19 < (uint *)(local_d8._M_string_length + local_100._M_string_length)) {
      uVar19 = (uint *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar3) {
        uVar19 = local_d8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar19 < (uint *)(local_d8._M_string_length + local_100._M_string_length))
      goto LAB_005294c6;
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_d8,0,(char *)0x0,(ulong)local_100._M_dataplus._M_p);
    }
    else {
LAB_005294c6:
      puVar10 = (undefined8 *)
                std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_d8._M_dataplus._M_p)
      ;
    }
    puVar13 = puVar10 + 2;
    if ((ulong *)*puVar10 == puVar13) {
      local_120._16_8_ = *puVar13;
      local_120._24_8_ = puVar10[3];
      local_120._0_8_ = puVar12;
    }
    else {
      local_120._16_8_ = *puVar13;
      local_120._0_8_ = (ulong *)*puVar10;
    }
    local_120._8_8_ = puVar10[1];
    *puVar10 = puVar13;
    puVar10[1] = 0;
    *(undefined1 *)puVar13 = 0;
    puVar10 = (undefined8 *)std::__cxx11::string::append(local_120);
    pIVar14 = (Int *)(puVar10 + 2);
    if ((Int *)*puVar10 == pIVar14) {
      iStack_138 = (int)*(undefined8 *)pIVar14;
      iStack_134 = (int)((ulong)*(undefined8 *)pIVar14 >> 0x20);
      uStack_130 = (undefined4)puVar10[3];
      uStack_12c = (undefined4)((ulong)puVar10[3] >> 0x20);
      local_148._0_8_ = (Int *)&iStack_138;
    }
    else {
      iStack_138 = (int)*(undefined8 *)pIVar14;
      iStack_134 = (int)((ulong)*(undefined8 *)pIVar14 >> 0x20);
      local_148._0_8_ = (Int *)*puVar10;
    }
    local_148._8_4_ = (undefined4)puVar10[1];
    local_148._12_4_ = (undefined4)((ulong)puVar10[1] >> 0x20);
    *puVar10 = pIVar14;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_e0,local_148._0_8_);
    if ((Int *)local_148._0_8_ != (Int *)&iStack_138) {
      ::operator_delete((void *)local_148._0_8_,CONCAT44(iStack_134,iStack_138) + 1);
    }
    if ((ulong *)local_120._0_8_ != puVar12) {
      ::operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar3) {
      ::operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar2) {
      ::operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
  }
  Unit::inferenceAsString_abi_cxx11_((string *)local_120,&this->super_Unit);
  puVar10 = (undefined8 *)std::__cxx11::string::replace((ulong)local_120,0,(char *)0x0,0x919892);
  pIVar14 = (Int *)(puVar10 + 2);
  if ((Int *)*puVar10 == pIVar14) {
    iStack_138 = (int)*(undefined8 *)pIVar14;
    iStack_134 = (int)((ulong)*(undefined8 *)pIVar14 >> 0x20);
    uStack_130 = (undefined4)puVar10[3];
    uStack_12c = (undefined4)((ulong)puVar10[3] >> 0x20);
    local_148._0_8_ = (Int *)&iStack_138;
  }
  else {
    iStack_138 = (int)*(undefined8 *)pIVar14;
    iStack_134 = (int)((ulong)*(undefined8 *)pIVar14 >> 0x20);
    local_148._0_8_ = (Int *)*puVar10;
  }
  local_148._8_4_ = (undefined4)puVar10[1];
  local_148._12_4_ = (undefined4)((ulong)puVar10[1] >> 0x20);
  *puVar10 = pIVar14;
  puVar10[1] = 0;
  *(undefined1 *)(puVar10 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_e0,local_148._0_8_);
  if ((Int *)local_148._0_8_ != (Int *)&iStack_138) {
    ::operator_delete((void *)local_148._0_8_,CONCAT44(iStack_134,iStack_138) + 1);
  }
  if ((ulong *)local_120._0_8_ != puVar12) {
    ::operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
  }
  if ((::Lib::env->_proofExtra).super_OptionValue<Shell::Options::ProofExtra>.actualValue == OFF)
  goto LAB_0052a264;
  local_148._0_8_ = (Int *)&iStack_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148," {","");
  std::__cxx11::string::_M_append((char *)local_e0,local_148._0_8_);
  if ((Int *)local_148._0_8_ != (Int *)&iStack_138) {
    ::operator_delete((void *)local_148._0_8_,CONCAT44(iStack_134,iStack_138) + 1);
  }
  local_120._0_8_ = puVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"a:","");
  ::Lib::Int::toString_abi_cxx11_(&local_100,(Int *)(ulong)(this->super_Unit)._inference._age,i);
  puVar18 = (uint *)0xf;
  if ((ulong *)local_120._0_8_ != puVar12) {
    puVar18 = (uint *)local_120._16_8_;
  }
  if (puVar18 < (uint *)(local_100._M_string_length + local_120._8_8_)) {
    uVar19 = (uint *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar2) {
      uVar19 = local_100.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar19 < (uint *)(local_100._M_string_length + local_120._8_8_)) goto LAB_00529753;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,local_120._0_8_);
  }
  else {
LAB_00529753:
    puVar10 = (undefined8 *)
              std::__cxx11::string::_M_append(local_120,(ulong)local_100._M_dataplus._M_p);
  }
  pIVar14 = (Int *)(puVar10 + 2);
  if ((Int *)*puVar10 == pIVar14) {
    iStack_138 = (int)*(undefined8 *)pIVar14;
    iStack_134 = (int)((ulong)*(undefined8 *)pIVar14 >> 0x20);
    uStack_130 = (undefined4)puVar10[3];
    uStack_12c = (undefined4)((ulong)puVar10[3] >> 0x20);
    local_148._0_8_ = (Int *)&iStack_138;
  }
  else {
    iStack_138 = (int)*(undefined8 *)pIVar14;
    iStack_134 = (int)((ulong)*(undefined8 *)pIVar14 >> 0x20);
    local_148._0_8_ = (Int *)*puVar10;
  }
  local_148._8_4_ = (undefined4)puVar10[1];
  local_148._12_4_ = (undefined4)((ulong)puVar10[1] >> 0x20);
  *puVar10 = pIVar14;
  puVar10[1] = 0;
  *pIVar14 = (Int)0x0;
  std::__cxx11::string::_M_append((char *)local_e0,local_148._0_8_);
  if ((Int *)local_148._0_8_ != (Int *)&iStack_138) {
    ::operator_delete((void *)local_148._0_8_,CONCAT44(iStack_134,iStack_138) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != paVar2) {
    ::operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if ((ulong *)local_120._0_8_ != puVar12) {
    ::operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
  }
  uVar16 = this->_weight;
  if (uVar16 == 0) {
    uVar11 = *(ulong *)&this->field_0x38 & 0xfffff;
    if (uVar11 == 0) {
      uVar16 = 0;
    }
    else {
      uVar16 = 0;
      do {
        uVar16 = uVar16 + (this->_literals[uVar11 - 1]->super_Term)._weight;
        bVar5 = 1 < (long)uVar11;
        uVar11 = uVar11 - 1;
      } while (bVar5);
    }
  }
  local_120._0_8_ = puVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,",w:","");
  ::Lib::Int::toString_abi_cxx11_(&local_100,(Int *)(ulong)uVar16,i_00);
  puVar18 = (uint *)0xf;
  if ((ulong *)local_120._0_8_ != puVar12) {
    puVar18 = (uint *)local_120._16_8_;
  }
  if (puVar18 < (uint *)(local_100._M_string_length + local_120._8_8_)) {
    uVar19 = (uint *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar2) {
      uVar19 = local_100.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar19 < (uint *)(local_100._M_string_length + local_120._8_8_)) goto LAB_0052989d;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,local_120._0_8_);
  }
  else {
LAB_0052989d:
    puVar10 = (undefined8 *)
              std::__cxx11::string::_M_append(local_120,(ulong)local_100._M_dataplus._M_p);
  }
  pIVar14 = (Int *)(puVar10 + 2);
  if ((Int *)*puVar10 == pIVar14) {
    iStack_138 = (int)*(undefined8 *)pIVar14;
    iStack_134 = (int)((ulong)*(undefined8 *)pIVar14 >> 0x20);
    uStack_130 = (undefined4)puVar10[3];
    uStack_12c = (undefined4)((ulong)puVar10[3] >> 0x20);
    local_148._0_8_ = (Int *)&iStack_138;
  }
  else {
    iStack_138 = (int)*(undefined8 *)pIVar14;
    iStack_134 = (int)((ulong)*(undefined8 *)pIVar14 >> 0x20);
    local_148._0_8_ = (Int *)*puVar10;
  }
  local_148._8_4_ = (undefined4)puVar10[1];
  local_148._12_4_ = (undefined4)((ulong)puVar10[1] >> 0x20);
  *puVar10 = pIVar14;
  puVar10[1] = 0;
  *pIVar14 = (Int)0x0;
  std::__cxx11::string::_M_append((char *)local_e0,local_148._0_8_);
  iVar15 = extraout_EDX_01;
  if ((Int *)local_148._0_8_ != (Int *)&iStack_138) {
    ::operator_delete((void *)local_148._0_8_,CONCAT44(iStack_134,iStack_138) + 1);
    iVar15 = extraout_EDX_02;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != paVar2) {
    ::operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    iVar15 = extraout_EDX_03;
  }
  if ((ulong *)local_120._0_8_ != puVar12) {
    ::operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
    iVar15 = extraout_EDX_04;
  }
  uVar7 = this->_weightForClauseSelection;
  if (uVar7 == 0) {
    uVar7 = computeWeightForClauseSelection(this,::Lib::env);
    iVar15 = extraout_EDX_05;
  }
  if (uVar7 != uVar16) {
    local_120._0_8_ = puVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_120,",wCS:","");
    ::Lib::Int::toString_abi_cxx11_(&local_100,(Int *)(ulong)uVar7,i_01);
    puVar18 = (uint *)0xf;
    if ((ulong *)local_120._0_8_ != puVar12) {
      puVar18 = (uint *)local_120._16_8_;
    }
    if (puVar18 < (uint *)(local_100._M_string_length + local_120._8_8_)) {
      uVar19 = (uint *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != paVar2) {
        uVar19 = local_100.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar19 < (uint *)(local_100._M_string_length + local_120._8_8_)) goto LAB_005299e0;
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,local_120._0_8_);
    }
    else {
LAB_005299e0:
      puVar10 = (undefined8 *)
                std::__cxx11::string::_M_append(local_120,(ulong)local_100._M_dataplus._M_p);
    }
    pIVar14 = (Int *)(puVar10 + 2);
    if ((Int *)*puVar10 == pIVar14) {
      iStack_138 = (int)*(undefined8 *)pIVar14;
      iStack_134 = (int)((ulong)*(undefined8 *)pIVar14 >> 0x20);
      uStack_130 = (undefined4)puVar10[3];
      uStack_12c = (undefined4)((ulong)puVar10[3] >> 0x20);
      local_148._0_8_ = (Int *)&iStack_138;
    }
    else {
      iStack_138 = (int)*(undefined8 *)pIVar14;
      iStack_134 = (int)((ulong)*(undefined8 *)pIVar14 >> 0x20);
      local_148._0_8_ = (Int *)*puVar10;
    }
    local_148._8_4_ = (undefined4)puVar10[1];
    local_148._12_4_ = (undefined4)((ulong)puVar10[1] >> 0x20);
    *puVar10 = pIVar14;
    puVar10[1] = 0;
    *pIVar14 = (Int)0x0;
    std::__cxx11::string::_M_append((char *)local_e0,local_148._0_8_);
    iVar15 = extraout_EDX_06;
    if ((Int *)local_148._0_8_ != (Int *)&iStack_138) {
      ::operator_delete((void *)local_148._0_8_,CONCAT44(iStack_134,iStack_138) + 1);
      iVar15 = extraout_EDX_07;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar2) {
      ::operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      iVar15 = extraout_EDX_08;
    }
    if ((ulong *)local_120._0_8_ != puVar12) {
      ::operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
      iVar15 = extraout_EDX_09;
    }
  }
  if ((*(uint *)&this->field_0x3b & 0xfffff00) != 0) {
    local_120._0_8_ = puVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_120,",nSel:","");
    ::Lib::Int::toString_abi_cxx11_
              (&local_100,(Int *)(ulong)(*(uint *)&this->field_0x3c & 0xfffff),i_02);
    puVar18 = (uint *)0xf;
    if ((ulong *)local_120._0_8_ != puVar12) {
      puVar18 = (uint *)local_120._16_8_;
    }
    if (puVar18 < (uint *)(local_100._M_string_length + local_120._8_8_)) {
      uVar19 = (uint *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != paVar2) {
        uVar19 = local_100.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar19 < (uint *)(local_100._M_string_length + local_120._8_8_)) goto LAB_00529b19;
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,local_120._0_8_);
    }
    else {
LAB_00529b19:
      puVar10 = (undefined8 *)
                std::__cxx11::string::_M_append(local_120,(ulong)local_100._M_dataplus._M_p);
    }
    pIVar14 = (Int *)(puVar10 + 2);
    if ((Int *)*puVar10 == pIVar14) {
      iStack_138 = (int)*(undefined8 *)pIVar14;
      iStack_134 = (int)((ulong)*(undefined8 *)pIVar14 >> 0x20);
      uStack_130 = (undefined4)puVar10[3];
      uStack_12c = (undefined4)((ulong)puVar10[3] >> 0x20);
      local_148._0_8_ = (Int *)&iStack_138;
    }
    else {
      iStack_138 = (int)*(undefined8 *)pIVar14;
      iStack_134 = (int)((ulong)*(undefined8 *)pIVar14 >> 0x20);
      local_148._0_8_ = (Int *)*puVar10;
    }
    local_148._8_4_ = (undefined4)puVar10[1];
    local_148._12_4_ = (undefined4)((ulong)puVar10[1] >> 0x20);
    *puVar10 = pIVar14;
    puVar10[1] = 0;
    *pIVar14 = (Int)0x0;
    std::__cxx11::string::_M_append((char *)local_e0,local_148._0_8_);
    iVar15 = extraout_EDX_10;
    if ((Int *)local_148._0_8_ != (Int *)&iStack_138) {
      ::operator_delete((void *)local_148._0_8_,CONCAT44(iStack_134,iStack_138) + 1);
      iVar15 = extraout_EDX_11;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar2) {
      ::operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      iVar15 = extraout_EDX_12;
    }
    if ((ulong *)local_120._0_8_ != puVar12) {
      ::operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
      iVar15 = extraout_EDX_13;
    }
  }
  if (DAT_00b7e200 == '\x01') {
    local_120._0_8_ = puVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_120,",col:","");
    iVar15 = extraout_EDX_14;
    if ((~*(uint *)&this->field_0x38 & 0x300000) == 0) {
      computeColor(this);
      iVar15 = extraout_EDX_15;
    }
    ::Lib::Int::toString_abi_cxx11_
              (&local_100,(Int *)(ulong)(*(uint *)&this->field_0x38 >> 0x14 & 3),iVar15);
    puVar18 = (uint *)0xf;
    if ((ulong *)local_120._0_8_ != puVar12) {
      puVar18 = (uint *)local_120._16_8_;
    }
    if (puVar18 < (uint *)(local_100._M_string_length + local_120._8_8_)) {
      uVar19 = (uint *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != paVar2) {
        uVar19 = local_100.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar19 < (uint *)(local_100._M_string_length + local_120._8_8_)) goto LAB_00529c5d;
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,local_120._0_8_);
    }
    else {
LAB_00529c5d:
      puVar10 = (undefined8 *)
                std::__cxx11::string::_M_append(local_120,(ulong)local_100._M_dataplus._M_p);
    }
    pIVar14 = (Int *)(puVar10 + 2);
    if ((Int *)*puVar10 == pIVar14) {
      iStack_138 = (int)*(undefined8 *)pIVar14;
      iStack_134 = (int)((ulong)*(undefined8 *)pIVar14 >> 0x20);
      uStack_130 = (undefined4)puVar10[3];
      uStack_12c = (undefined4)((ulong)puVar10[3] >> 0x20);
      local_148._0_8_ = (Int *)&iStack_138;
    }
    else {
      iStack_138 = (int)*(undefined8 *)pIVar14;
      iStack_134 = (int)((ulong)*(undefined8 *)pIVar14 >> 0x20);
      local_148._0_8_ = (Int *)*puVar10;
    }
    local_148._8_4_ = (undefined4)puVar10[1];
    local_148._12_4_ = (undefined4)((ulong)puVar10[1] >> 0x20);
    *puVar10 = pIVar14;
    puVar10[1] = 0;
    *pIVar14 = (Int)0x0;
    std::__cxx11::string::_M_append((char *)local_e0,local_148._0_8_);
    iVar15 = extraout_EDX_16;
    if ((Int *)local_148._0_8_ != (Int *)&iStack_138) {
      ::operator_delete((void *)local_148._0_8_,CONCAT44(iStack_134,iStack_138) + 1);
      iVar15 = extraout_EDX_17;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar2) {
      ::operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      iVar15 = extraout_EDX_18;
    }
    if ((ulong *)local_120._0_8_ != puVar12) {
      ::operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
      iVar15 = extraout_EDX_19;
    }
  }
  if ((undefined1  [48])((undefined1  [48])(this->super_Unit)._inference & (undefined1  [48])0x18)
      != (undefined1  [48])0x0) {
    local_148._0_8_ = (Int *)&iStack_138;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_148,",goal:1","");
    std::__cxx11::string::_M_append((char *)local_e0,local_148._0_8_);
    iVar15 = extraout_EDX_20;
    if ((Int *)local_148._0_8_ != (Int *)&iStack_138) {
      ::operator_delete((void *)local_148._0_8_,CONCAT44(iStack_134,iStack_138) + 1);
      iVar15 = extraout_EDX_21;
    }
  }
  if (1 < DAT_00b7e1c8) {
    local_120._0_8_ = puVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_120,",sine:","");
    ::Lib::Int::toString_abi_cxx11_
              (&local_100,(Int *)(ulong)(byte)(this->super_Unit)._inference.field_0x4,i_03);
    puVar18 = (uint *)0xf;
    if ((ulong *)local_120._0_8_ != puVar12) {
      puVar18 = (uint *)local_120._16_8_;
    }
    if (puVar18 < (uint *)(local_100._M_string_length + local_120._8_8_)) {
      uVar19 = (uint *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != paVar2) {
        uVar19 = local_100.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar19 < (uint *)(local_100._M_string_length + local_120._8_8_)) goto LAB_00529dd0;
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,local_120._0_8_);
    }
    else {
LAB_00529dd0:
      puVar10 = (undefined8 *)
                std::__cxx11::string::_M_append(local_120,(ulong)local_100._M_dataplus._M_p);
    }
    pIVar14 = (Int *)(puVar10 + 2);
    if ((Int *)*puVar10 == pIVar14) {
      iStack_138 = (int)*(undefined8 *)pIVar14;
      iStack_134 = (int)((ulong)*(undefined8 *)pIVar14 >> 0x20);
      uStack_130 = (undefined4)puVar10[3];
      uStack_12c = (undefined4)((ulong)puVar10[3] >> 0x20);
      local_148._0_8_ = (Int *)&iStack_138;
    }
    else {
      iStack_138 = (int)*(undefined8 *)pIVar14;
      iStack_134 = (int)((ulong)*(undefined8 *)pIVar14 >> 0x20);
      local_148._0_8_ = (Int *)*puVar10;
    }
    local_148._8_4_ = (undefined4)puVar10[1];
    local_148._12_4_ = (undefined4)((ulong)puVar10[1] >> 0x20);
    *puVar10 = pIVar14;
    puVar10[1] = 0;
    *pIVar14 = (Int)0x0;
    std::__cxx11::string::_M_append((char *)local_e0,local_148._0_8_);
    iVar15 = extraout_EDX_22;
    if ((Int *)local_148._0_8_ != (Int *)&iStack_138) {
      ::operator_delete((void *)local_148._0_8_,CONCAT44(iStack_134,iStack_138) + 1);
      iVar15 = extraout_EDX_23;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar2) {
      ::operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      iVar15 = extraout_EDX_24;
    }
    if ((ulong *)local_120._0_8_ != puVar12) {
      ::operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
      iVar15 = extraout_EDX_25;
    }
  }
  if (((this->super_Unit)._inference.field_0x2 & 2) != 0) {
    local_148._0_8_ = (Int *)&iStack_138;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_148,",ptD:1","");
    std::__cxx11::string::_M_append((char *)local_e0,local_148._0_8_);
    iVar15 = extraout_EDX_26;
    if ((Int *)local_148._0_8_ != (Int *)&iStack_138) {
      ::operator_delete((void *)local_148._0_8_,CONCAT44(iStack_134,iStack_138) + 1);
      iVar15 = extraout_EDX_27;
    }
  }
  if ((::Lib::env->_induction).super_OptionValue<Shell::Options::Induction>.actualValue != NONE) {
    local_120._0_8_ = puVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_120,",inD:","");
    ::Lib::Int::toString_abi_cxx11_
              (&local_100,(Int *)(ulong)(*(uint *)&(this->super_Unit)._inference >> 0x15 & 0x1f),
               i_04);
    puVar18 = (uint *)0xf;
    if ((ulong *)local_120._0_8_ != puVar12) {
      puVar18 = (uint *)local_120._16_8_;
    }
    if (puVar18 < (uint *)(local_100._M_string_length + local_120._8_8_)) {
      uVar19 = (uint *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != paVar2) {
        uVar19 = local_100.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar19 < (uint *)(local_100._M_string_length + local_120._8_8_)) goto LAB_00529f4f;
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,local_120._0_8_);
    }
    else {
LAB_00529f4f:
      puVar10 = (undefined8 *)
                std::__cxx11::string::_M_append(local_120,(ulong)local_100._M_dataplus._M_p);
    }
    pIVar14 = (Int *)(puVar10 + 2);
    if ((Int *)*puVar10 == pIVar14) {
      iStack_138 = (int)*(undefined8 *)pIVar14;
      iStack_134 = (int)((ulong)*(undefined8 *)pIVar14 >> 0x20);
      uStack_130 = (undefined4)puVar10[3];
      uStack_12c = (undefined4)((ulong)puVar10[3] >> 0x20);
      local_148._0_8_ = (Int *)&iStack_138;
    }
    else {
      iStack_138 = (int)*(undefined8 *)pIVar14;
      iStack_134 = (int)((ulong)*(undefined8 *)pIVar14 >> 0x20);
      local_148._0_8_ = (Int *)*puVar10;
    }
    local_148._8_4_ = (undefined4)puVar10[1];
    local_148._12_4_ = (undefined4)((ulong)puVar10[1] >> 0x20);
    *puVar10 = pIVar14;
    puVar10[1] = 0;
    *pIVar14 = (Int)0x0;
    std::__cxx11::string::_M_append((char *)local_e0,local_148._0_8_);
    iVar15 = extraout_EDX_28;
    if ((Int *)local_148._0_8_ != (Int *)&iStack_138) {
      ::operator_delete((void *)local_148._0_8_,CONCAT44(iStack_134,iStack_138) + 1);
      iVar15 = extraout_EDX_29;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar2) {
      ::operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      iVar15 = extraout_EDX_30;
    }
    if ((ulong *)local_120._0_8_ != puVar12) {
      ::operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
      iVar15 = extraout_EDX_31;
    }
  }
  ::Lib::Int::toString_abi_cxx11_
            ((string *)local_120,(Int *)(ulong)(uint)(int)(this->super_Unit)._inference.th_ancestors
             ,iVar15);
  psVar6 = local_e0;
  puVar10 = (undefined8 *)std::__cxx11::string::replace((ulong)local_120,0,(char *)0x0,0x9170a4);
  pIVar14 = (Int *)(puVar10 + 2);
  if ((Int *)*puVar10 == pIVar14) {
    iStack_138 = (int)*(undefined8 *)pIVar14;
    iStack_134 = (int)((ulong)*(undefined8 *)pIVar14 >> 0x20);
    uStack_130 = (undefined4)puVar10[3];
    uStack_12c = (undefined4)((ulong)puVar10[3] >> 0x20);
    local_148._0_8_ = (Int *)&iStack_138;
  }
  else {
    iStack_138 = (int)*(undefined8 *)pIVar14;
    iStack_134 = (int)((ulong)*(undefined8 *)pIVar14 >> 0x20);
    local_148._0_8_ = (Int *)*puVar10;
  }
  local_148._8_4_ = (undefined4)puVar10[1];
  local_148._12_4_ = (undefined4)((ulong)puVar10[1] >> 0x20);
  *puVar10 = pIVar14;
  puVar10[1] = 0;
  *(undefined1 *)(puVar10 + 2) = 0;
  std::__cxx11::string::_M_append((char *)psVar6,local_148._0_8_);
  iVar15 = extraout_EDX_32;
  if ((Int *)local_148._0_8_ != (Int *)&iStack_138) {
    ::operator_delete((void *)local_148._0_8_,CONCAT44(iStack_134,iStack_138) + 1);
    iVar15 = extraout_EDX_33;
  }
  if ((ulong *)local_120._0_8_ != puVar12) {
    ::operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
    iVar15 = extraout_EDX_34;
  }
  ::Lib::Int::toString_abi_cxx11_
            ((string *)local_120,
             (Int *)(ulong)(uint)(int)(this->super_Unit)._inference.all_ancestors,iVar15);
  puVar10 = (undefined8 *)std::__cxx11::string::replace((ulong)local_120,0,(char *)0x0,0x9170ab);
  pIVar14 = (Int *)(puVar10 + 2);
  if ((Int *)*puVar10 == pIVar14) {
    iStack_138 = (int)*(undefined8 *)pIVar14;
    iStack_134 = (int)((ulong)*(undefined8 *)pIVar14 >> 0x20);
    uStack_130 = (undefined4)puVar10[3];
    uStack_12c = (undefined4)((ulong)puVar10[3] >> 0x20);
    this_00 = (Int *)&iStack_138;
  }
  else {
    iStack_138 = (int)*(undefined8 *)pIVar14;
    iStack_134 = (int)((ulong)*(undefined8 *)pIVar14 >> 0x20);
    this_00 = (Int *)*puVar10;
  }
  local_148._8_4_ = (undefined4)puVar10[1];
  local_148._12_4_ = (undefined4)((ulong)puVar10[1] >> 0x20);
  *puVar10 = pIVar14;
  puVar10[1] = 0;
  *(undefined1 *)(puVar10 + 2) = 0;
  local_148._0_8_ = this_00;
  std::__cxx11::string::_M_append((char *)psVar6,(ulong)this_00);
  if ((Int *)local_148._0_8_ != (Int *)&iStack_138) {
    this_00 = (Int *)(CONCAT44(iStack_134,iStack_138) + 1);
    ::operator_delete((void *)local_148._0_8_,(ulong)this_00);
  }
  if ((ulong *)local_120._0_8_ != puVar12) {
    this_00 = (Int *)(local_120._16_8_ + 1);
    ::operator_delete((void *)local_120._0_8_,(ulong)this_00);
  }
  ::Lib::Int::toString_abi_cxx11_
            ((string *)local_120,this_00,
             (double)((float)(::Lib::env->_theorySplitQueueExpectedRatioDenom).
                             super_OptionValue<int>.actualValue *
                      (this->super_Unit)._inference.th_ancestors -
                     (this->super_Unit)._inference.all_ancestors));
  puVar10 = (undefined8 *)std::__cxx11::string::replace((ulong)local_120,0,(char *)0x0,0x9170b3);
  pIVar14 = (Int *)(puVar10 + 2);
  if ((Int *)*puVar10 == pIVar14) {
    iStack_138 = (int)*(undefined8 *)pIVar14;
    iStack_134 = (int)((ulong)*(undefined8 *)pIVar14 >> 0x20);
    uStack_130 = (undefined4)puVar10[3];
    uStack_12c = (undefined4)((ulong)puVar10[3] >> 0x20);
    local_148._0_8_ = (Int *)&iStack_138;
  }
  else {
    iStack_138 = (int)*(undefined8 *)pIVar14;
    iStack_134 = (int)((ulong)*(undefined8 *)pIVar14 >> 0x20);
    local_148._0_8_ = (Int *)*puVar10;
  }
  local_148._8_4_ = (undefined4)puVar10[1];
  local_148._12_4_ = (undefined4)((ulong)puVar10[1] >> 0x20);
  *puVar10 = pIVar14;
  puVar10[1] = 0;
  *(undefined1 *)(puVar10 + 2) = 0;
  std::__cxx11::string::_M_append((char *)psVar6,local_148._0_8_);
  if ((Int *)local_148._0_8_ != (Int *)&iStack_138) {
    ::operator_delete((void *)local_148._0_8_,CONCAT44(iStack_134,iStack_138) + 1);
  }
  if ((ulong *)local_120._0_8_ != puVar12) {
    ::operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
  }
  local_148._0_8_ = (Int *)&iStack_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"}","");
  std::__cxx11::string::_M_append((char *)psVar6,local_148._0_8_);
  if ((Int *)local_148._0_8_ != (Int *)&iStack_138) {
    ::operator_delete((void *)local_148._0_8_,CONCAT44(iStack_134,iStack_138) + 1);
  }
LAB_0052a264:
  if (local_b0[0] != local_a0) {
    ::operator_delete(local_b0[0],local_a0[0] + 1);
  }
  return local_e0;
}

Assistant:

std::string Clause::toString() const
{
  std::string quantifier = "";
  if(env.options->proofExtra() != Options::ProofExtra::OFF){
    DHMap<unsigned,TermList> varSortMap;
    SortHelper::collectVariableSorts(const_cast<Clause*>(this),varSortMap);
    auto vars = Stack<unsigned>::fromIterator(varSortMap.domain());
    vars.sort();
    unsigned numVars = vars.size();
    if (numVars) {
      quantifier += "![";
      for (auto var : vars) {
        quantifier += TermList(var,false).toString() + ":" + varSortMap.get(var).toString();
        if (--numVars) {
          quantifier += ", ";
        }
      }
      quantifier += "]: ";
    }
  }

  // print id and literals of clause
  std::string result = Int::toString(_number) + ". "+ quantifier + literalsOnlyToString();

  // print avatar components clause depends on
  if (splits() && !splits()->isEmpty()) {
    result += std::string(" <- (") + Splitter::splitsToString(splits()) + ")";
  }

  // print inference and ids of parent clauses
  result += " " + inferenceAsString();

  if(env.options->proofExtra() != Options::ProofExtra::OFF){
    // print statistics: each entry should have the form key:value
    result += std::string(" {");

    result += std::string("a:") + Int::toString(age());
    unsigned weight = (_weight ? _weight : computeWeight());
    result += std::string(",w:") + Int::toString(weight);

    unsigned weightForClauseSelection = (_weightForClauseSelection ? _weightForClauseSelection : computeWeightForClauseSelection(*env.options));
    if(weightForClauseSelection!=weight){
      result += std::string(",wCS:") + Int::toString(weightForClauseSelection);
    }

    if (numSelected()>0) {
      result += std::string(",nSel:") + Int::toString(numSelected());
    }

    if (env.colorUsed) {
      result += std::string(",col:") + Int::toString(color());
    }

    if(derivedFromGoal()){
      result += std::string(",goal:1");
    }
    if(env.maxSineLevel > 1) { // this is a cryptic way of saying "did we run Sine to compute sine levels?"
      result += std::string(",sine:")+Int::toString((unsigned)_inference.getSineLevel());
    }

    if(isPureTheoryDescendant()){
      result += std::string(",ptD:1");
    }

    if(env.options->induction() != Shell::Options::Induction::NONE){
      result += std::string(",inD:") + Int::toString(_inference.inductionDepth());
    }
    result += ",thAx:" + Int::toString((int)(_inference.th_ancestors));
    result += ",allAx:" + Int::toString((int)(_inference.all_ancestors));

    result += ",thDist:" + Int::toString( _inference.th_ancestors * env.options->theorySplitQueueExpectedRatioDenom() - _inference.all_ancestors);
    result += std::string("}");
  }

  return result;
}